

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setFunction
          (SignalPtr<double,_int> *this,function2<double_&,_double_&,_int> *t,Mutex *m)

{
  _func_int *p_Var1;
  function2<double_&,_double_&,_int> local_40;
  
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  p_Var1 = this->_vptr_SignalPtr[-3];
  boost::function2<double_&,_double_&,_int>::function2(&local_40,t);
  Signal<double,_int>::setFunction
            ((Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)p_Var1),&local_40,m);
  boost::function2<double_&,_double_&,_int>::~function2(&local_40);
  return;
}

Assistant:

virtual void setFunction(boost::function2<T &, T &, Time> t,
                           typename Signal<T, Time>::Mutex *m = NULL) {
    plug(this);
    Signal<T, Time>::setFunction(t, m);
  }